

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O0

void toml::detail::skip_string_like<toml::type_config>
               (location *loc,context<toml::type_config> *param_2)

{
  bool bVar1;
  byte bVar2;
  char_type_conflict cVar3;
  location *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  byte in_stack_fffffffffffffda7;
  size_t in_stack_fffffffffffffda8;
  undefined1 *n;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  undefined1 local_220 [48];
  location *in_stack_fffffffffffffe10;
  literal *in_stack_fffffffffffffe18;
  
  literal::literal<4ul>
            ((literal *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
             (char (*) [4])in_stack_fffffffffffffd98);
  literal::scan(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  bVar1 = region::is_ok((region *)0x767b59);
  region::~region((region *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
  literal::~literal((literal *)0x767b77);
  if (bVar1) {
    while (bVar1 = location::eof((location *)
                                 CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      literal::literal<4ul>
                ((literal *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                 (char (*) [4])in_stack_fffffffffffffd98);
      literal::scan(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      bVar1 = region::is_ok((region *)0x767be0);
      region::~region((region *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
      literal::~literal((literal *)0x767bfe);
      if (bVar1) {
        return;
      }
      location::advance((location *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                        in_stack_fffffffffffffda8);
    }
  }
  else {
    literal::literal<4ul>
              ((literal *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
               (char (*) [4])in_stack_fffffffffffffd98);
    literal::scan(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    bVar2 = region::is_ok((region *)0x767cb7);
    region::~region((region *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    literal::~literal((literal *)0x767cd5);
    if ((bVar2 & 1) == 0) {
      cVar3 = location::current(in_stack_fffffffffffffd98);
      if (cVar3 == '\"') {
        do {
          bVar1 = location::eof((location *)
                                CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            return;
          }
          location::advance((location *)CONCAT17(bVar2,in_stack_fffffffffffffdb0),
                            in_stack_fffffffffffffda8);
          cVar3 = location::current(in_stack_fffffffffffffd98);
        } while ((cVar3 != '\"') &&
                (cVar3 = location::current(in_stack_fffffffffffffd98), cVar3 != '\n'));
        location::advance((location *)CONCAT17(bVar2,in_stack_fffffffffffffdb0),
                          in_stack_fffffffffffffda8);
      }
      else {
        cVar3 = location::current(in_stack_fffffffffffffd98);
        if (cVar3 == '\'') {
          do {
            bVar1 = location::eof((location *)
                                  CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              return;
            }
            location::advance((location *)CONCAT17(bVar2,in_stack_fffffffffffffdb0),
                              in_stack_fffffffffffffda8);
            cVar3 = location::current(in_stack_fffffffffffffd98);
          } while ((cVar3 != '\'') &&
                  (cVar3 = location::current(in_stack_fffffffffffffd98), cVar3 != '\n'));
          location::advance((location *)CONCAT17(bVar2,in_stack_fffffffffffffdb0),
                            in_stack_fffffffffffffda8);
        }
      }
    }
    else {
      while (bVar1 = location::eof((location *)
                                   CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0)),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        n = local_220;
        literal::literal<4ul>
                  ((literal *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                   (char (*) [4])in_stack_fffffffffffffd98);
        literal::scan(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
        in_stack_fffffffffffffda7 = region::is_ok((region *)0x767d35);
        region::~region((region *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
        literal::~literal((literal *)0x767d4d);
        if ((in_stack_fffffffffffffda7 & 1) != 0) {
          return;
        }
        location::advance((location *)CONCAT17(bVar2,in_stack_fffffffffffffdb0),(size_t)n);
      }
    }
  }
  return;
}

Assistant:

void skip_string_like(location& loc, const context<TC>&)
{
    // if """ is found, skip until the closing """ is found.
    if(literal("\"\"\"").scan(loc).is_ok())
    {
        while( ! loc.eof())
        {
            if(literal("\"\"\"").scan(loc).is_ok())
            {
                return;
            }
            loc.advance();
        }
    }
    else if(literal("'''").scan(loc).is_ok())
    {
        while( ! loc.eof())
        {
            if(literal("'''").scan(loc).is_ok())
            {
                return;
            }
            loc.advance();
        }
    }
    // if " is found, skip until the closing " or newline is found.
    else if(loc.current() == '"')
    {
        while( ! loc.eof())
        {
            loc.advance();
            if(loc.current() == '"' || loc.current() == '\n')
            {
                loc.advance();
                return;
            }
        }
    }
    else if(loc.current() == '\'')
    {
        while( ! loc.eof())
        {
            loc.advance();
            if(loc.current() == '\'' || loc.current() == '\n')
            {
                loc.advance();
                return ;
            }
        }
    }
    return;
}